

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

void XCore_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *in_RDI;
  
  MCRegisterInfo_InitMCRegisterInfo
            (in_RDI,XCoreRegDesc,0x11,0,0,XCoreMCRegisterClasses,2,(uint16_t (*) [2])0x0,0,
             XCoreRegDiffLists,(char *)0x0,XCoreSubRegIdxLists,1,(uint16_t *)0x0);
  return;
}

Assistant:

void XCore_init(MCRegisterInfo *MRI)
{
	/*
	InitMCRegisterInfo(XCoreRegDesc, 17, RA, PC,
			XCoreMCRegisterClasses, 2,
			XCoreRegUnitRoots,
			16,
			XCoreRegDiffLists,
			XCoreRegStrings,
			XCoreSubRegIdxLists,
			1,
			XCoreSubRegIdxRanges,
			XCoreRegEncodingTable);
	*/


	MCRegisterInfo_InitMCRegisterInfo(MRI, XCoreRegDesc, 17,
			0, 0,
			XCoreMCRegisterClasses, 2,
			0, 0,
			XCoreRegDiffLists,
			0,
			XCoreSubRegIdxLists, 1,
			0);
}